

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

ssize_t write_block(int fd,void *buf,size_t nbyte)

{
  ssize_t sVar1;
  size_t total;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    sVar1 = write(fd,buf,nbyte);
    if (sVar1 < 1) break;
    nbyte = nbyte - sVar1;
    buf = (void *)((long)buf + sVar1);
    lVar2 = lVar2 + sVar1;
  }
  if (sVar1 == 0) {
    sVar1 = lVar2;
  }
  return sVar1;
}

Assistant:

ssize_t write_block(int fd, const void *buf, size_t nbyte) {
  ssize_t wr;
  size_t total;
  total = 0;
  while ((wr = write(fd, buf, nbyte)) > 0) {
    nbyte -= wr;
    buf = (char *)buf + wr;
    total += wr;
  }
  if (wr < 0) {
    return wr;
  } else {
    return total;
  }
}